

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.cpp
# Opt level: O3

int luaopen_math(lua_State *L)

{
  luaL_register(L,"math",mathlib);
  lua_pushnumber(L,3.141592653589793);
  lua_setfield(L,-2,"pi");
  lua_pushnumber(L,INFINITY);
  lua_setfield(L,-2,"huge");
  lua_getfield(L,-1,"fmod");
  lua_setfield(L,-2,"mod");
  return 1;
}

Assistant:

LUALIB_API int luaopen_math (lua_State *L) {
  luaL_register(L, LUA_MATHLIBNAME, mathlib);
  lua_pushnumber(L, PI);
  lua_setfield(L, -2, "pi");
  lua_pushnumber(L, HUGE_VAL);
  lua_setfield(L, -2, "huge");
#if defined(LUA_COMPAT_MOD)
  lua_getfield(L, -1, "fmod");
  lua_setfield(L, -2, "mod");
#endif
  return 1;
}